

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  u8 uVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  char *pEnd_1;
  byte *pbVar13;
  int iVar14;
  sqlite3_int64 iVal;
  char *p_1;
  long local_90;
  byte *local_88;
  byte *local_80;
  byte *local_78;
  byte *local_70;
  int local_68;
  int local_64;
  byte *local_60;
  long local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  long local_38;
  
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar7 = p->iDoclistToken;
    if (iVar7 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pbVar8 = (byte *)(p->doclist).aAll;
      if (pbVar8 != (byte *)0x0) {
        iVar14 = (p->doclist).nAll;
        local_64 = iVar7 - iToken;
        if (iVar7 < iToken) {
          local_78 = (byte *)CONCAT44(local_78._4_4_,iVar14);
          local_64 = iToken - iVar7;
          pbVar13 = (byte *)pList;
          pList = (char *)pbVar8;
          iVar14 = nList;
        }
        else {
          local_78 = (byte *)CONCAT44(local_78._4_4_,nList);
          pbVar13 = pbVar8;
        }
        uVar1 = pTab->bDescIdx;
        pbVar8 = pbVar13;
        if ((uVar1 == '\0') || (pbVar8 = (byte *)sqlite3_malloc(iVar14 + 10), pbVar8 != (byte *)0x0)
           ) {
          local_70 = pbVar8;
          local_68 = iToken;
          local_60 = pbVar13;
          if ((int)local_78 < 1) {
            pbVar13 = (byte *)0x0;
            lVar10 = 0;
          }
          else {
            iVar7 = sqlite3Fts3GetVarint(pList,&local_90);
            pbVar13 = (byte *)pList + iVar7;
            lVar10 = local_90;
          }
          pbVar4 = local_60;
          iVar7 = (int)pbVar8;
          local_80 = pbVar13;
          if (0 < iVar14) {
            local_50 = pbVar8;
            local_48 = (byte *)pList;
            iVar7 = sqlite3Fts3GetVarint((char *)local_60,&local_90);
            local_88 = pbVar4 + iVar7;
            local_58 = local_90;
            iVar7 = (int)local_50;
            pbVar8 = local_50;
            pList = (char *)local_48;
            if (pbVar13 != (byte *)0x0) {
              local_40 = local_48 + (int)local_78;
              local_78 = local_60 + iVar14;
              bVar3 = false;
              lVar11 = 0;
              do {
                pbVar8 = local_70;
                lVar9 = -(lVar10 - local_58);
                if (uVar1 == '\0') {
                  lVar9 = lVar10 - local_58;
                }
                if (lVar9 == 0) {
                  uVar12 = lVar11 - lVar10;
                  if (!bVar3) {
                    uVar12 = lVar10 - lVar11;
                  }
                  if (uVar1 == '\0') {
                    uVar12 = lVar10 - lVar11;
                  }
                  do {
                    pbVar13 = local_70;
                    bVar5 = (byte)uVar12;
                    *pbVar13 = bVar5 | 0x80;
                    local_70 = pbVar13 + 1;
                    bVar2 = 0x7f < uVar12;
                    uVar12 = uVar12 >> 7;
                  } while (bVar2);
                  *pbVar13 = bVar5;
                  local_38 = lVar11;
                  iVar7 = fts3PoslistPhraseMerge
                                    ((char **)&local_70,local_64,0,1,(char **)&local_80,
                                     (char **)&local_88);
                  pbVar13 = local_80;
                  lVar11 = lVar10;
                  bVar2 = true;
                  if (iVar7 == 0) {
                    lVar11 = local_38;
                    local_70 = pbVar8;
                    bVar2 = bVar3;
                  }
                  if (local_80 < local_40) {
                    iVar7 = sqlite3Fts3GetVarint((char *)local_80,&local_90);
                    pbVar13 = pbVar13 + iVar7;
                    lVar9 = -local_90;
                    if (uVar1 == '\0') {
                      lVar9 = local_90;
                    }
                    lVar10 = lVar10 + lVar9;
                  }
                  else {
                    pbVar13 = (byte *)0x0;
                  }
                  pbVar8 = local_88;
                  local_80 = pbVar13;
                  if (local_78 <= local_88) goto LAB_0017e7ef;
                  iVar7 = sqlite3Fts3GetVarint((char *)local_88,&local_90);
                  local_88 = pbVar8 + iVar7;
                  lVar9 = -local_90;
                  if (uVar1 == '\0') {
                    lVar9 = local_90;
                  }
                  local_58 = local_58 + lVar9;
                  bVar3 = bVar2;
                }
                else if (lVar9 < 0) {
                  bVar5 = *pbVar13;
                  if (*pbVar13 != 0) {
                    do {
                      pbVar8 = pbVar13 + 1;
                      pbVar13 = pbVar13 + 1;
                      bVar6 = bVar5 & 0x80;
                      bVar5 = *pbVar8;
                    } while (bVar6 != 0 || *pbVar8 != 0);
                  }
                  local_80 = pbVar13 + 1;
                  if (local_40 <= local_80) goto LAB_0017e7ef;
                  iVar7 = sqlite3Fts3GetVarint((char *)local_80,&local_90);
                  pbVar13 = local_80 + iVar7;
                  lVar9 = -local_90;
                  if (uVar1 == '\0') {
                    lVar9 = local_90;
                  }
                  lVar10 = lVar10 + lVar9;
                  local_80 = pbVar13;
                }
                else {
                  bVar5 = *local_88;
                  if (*local_88 != 0) {
                    do {
                      pbVar8 = local_88 + 1;
                      local_88 = local_88 + 1;
                      bVar6 = bVar5 & 0x80;
                      bVar5 = *pbVar8;
                    } while (bVar6 != 0 || *pbVar8 != 0);
                  }
                  local_88 = local_88 + 1;
                  if (local_78 <= local_88) goto LAB_0017e7ef;
                  iVar7 = sqlite3Fts3GetVarint((char *)local_88,&local_90);
                  local_88 = local_88 + iVar7;
                  lVar9 = -local_90;
                  if (uVar1 == '\0') {
                    lVar9 = local_90;
                  }
                  local_58 = local_58 + lVar9;
                  pbVar13 = local_80;
                }
                if ((pbVar13 == (byte *)0x0) || (local_88 == (byte *)0x0)) goto LAB_0017e7ef;
              } while( true );
            }
          }
          goto LAB_0017e7fe;
        }
        iVar7 = 7;
        iToken = iToken;
        goto LAB_0017e82d;
      }
      sqlite3_free(pList);
    }
  }
  iVar7 = 0;
  goto LAB_0017e83c;
LAB_0017e7ef:
  iVar7 = (int)local_70;
  pbVar8 = local_50;
  pList = (char *)local_48;
LAB_0017e7fe:
  iVar14 = iVar7 - (int)pbVar8;
  iVar7 = 0;
  pbVar13 = local_60;
  iToken = local_68;
  if (uVar1 != '\0') {
    sqlite3_free(local_60);
    pbVar13 = pbVar8;
    iToken = local_68;
    iVar7 = 0;
  }
LAB_0017e82d:
  sqlite3_free(pList);
  (p->doclist).aAll = (char *)pbVar13;
  (p->doclist).nAll = iVar14;
LAB_0017e83c:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  return iVar7;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}